

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_debugger.cpp
# Opt level: O1

bool __thiscall Debugger::ProcessBreakPoint(Debugger *this,shared_ptr<BreakPoint> *bp)

{
  Arena<Variable> *pAVar1;
  bool bVar2;
  int iVar3;
  Variable *pVVar4;
  Idx<Variable> id;
  Idx<Variable> id_00;
  shared_ptr<EvalContext> ctx;
  undefined1 local_59;
  EvalContext *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  shared_ptr<BreakPoint> local_48;
  shared_ptr<EvalContext> local_38;
  shared_ptr<BreakPoint> local_28;
  
  local_48.super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (bp->super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (((local_48.super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->condition).
      _M_string_length == 0) {
    if (((local_48.super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->logMessage).
        _M_string_length != 0) {
      local_48.super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (bp->super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
      if (local_48.super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_48.super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (local_48.super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_48.super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (local_48.super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      DoLogMessage(this,&local_48);
      if (local_48.super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_48.super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      return false;
    }
    if (((local_48.super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hitCondition)
        ._M_string_length == 0) {
      return true;
    }
    (local_48.super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hitCount =
         (local_48.super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hitCount + 1;
    local_28.super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (bp->super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    if (local_28.super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_28.super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_28.super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_28.super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_28.super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    local_28.super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_48.super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    bVar2 = DoHitCondition(this,&local_28);
    local_50._M_pi =
         local_28.super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  }
  else {
    local_58 = (EvalContext *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<EvalContext,std::allocator<EvalContext>>
              (&local_50,&local_58,(allocator<EvalContext> *)&local_59);
    std::__cxx11::string::_M_assign((string *)&local_58->expr);
    local_58->depth = 1;
    local_38.super___shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_58;
    local_38.super___shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         local_50._M_pi;
    if (local_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_50._M_pi)->_M_use_count = (local_50._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_50._M_pi)->_M_use_count = (local_50._M_pi)->_M_use_count + 1;
      }
    }
    bVar2 = DoEval(this,&local_38);
    if (local_38.super___shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_38.super___shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if ((bVar2) &&
       (pAVar1 = (local_58->result)._arena, id._4_4_ = 0, id.Raw = (local_58->result).Raw,
       id._arena = pAVar1, pVVar4 = Arena<Variable>::Index(pAVar1,id), pVVar4->valueType == 1)) {
      pAVar1 = (local_58->result)._arena;
      id_00._4_4_ = 0;
      id_00.Raw = (local_58->result).Raw;
      id_00._arena = pAVar1;
      pVVar4 = Arena<Variable>::Index(pAVar1,id_00);
      iVar3 = std::__cxx11::string::compare((char *)&pVVar4->value);
      bVar2 = iVar3 == 0;
    }
    else {
      bVar2 = false;
    }
  }
  if (local_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50._M_pi);
  }
  return bVar2;
}

Assistant:

bool Debugger::ProcessBreakPoint(std::shared_ptr<BreakPoint> bp) {
	if (!bp->condition.empty()) {
		auto ctx = std::make_shared<EvalContext>();
		ctx->expr = bp->condition;
		ctx->depth = 1;
		bool suc = DoEval(ctx);
		return suc && ctx->result->valueType == LUA_TBOOLEAN && ctx->result->value == "true";
	}
	if (!bp->logMessage.empty()) {
		DoLogMessage(bp);
		return false;
	}
	if (!bp->hitCondition.empty()) {
		bp->hitCount++;

		return DoHitCondition(bp);
	}
	return true;
}